

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opengltexture.h
# Opt level: O0

void __thiscall rengine::OpenGLTexture::upload(OpenGLTexture *this,int width,int height,void *data)

{
  vec2 local_28;
  void *local_20;
  void *data_local;
  int height_local;
  int width_local;
  OpenGLTexture *this_local;
  
  local_20 = data;
  data_local._0_4_ = height;
  data_local._4_4_ = width;
  _height_local = this;
  if (this->m_id == 0) {
    glGenTextures(1,&this->m_id);
    glBindTexture(0xde1,this->m_id);
    glTexParameteri(0xde1,0x2801,0x2601);
  }
  else {
    glBindTexture(0xde1,this->m_id);
  }
  vec2::vec2(&local_28,(float)data_local._4_4_,(float)(int)data_local);
  this->m_size = local_28;
  glTexImage2D(0xde1,0,0x1908,data_local._4_4_,(int)data_local,0,0x1908,0x1401,local_20);
  return;
}

Assistant:

void upload(int width, int height, void *data)
    {
        if (m_id == 0) {
            glGenTextures(1, &m_id);
            glBindTexture(GL_TEXTURE_2D, m_id);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
        } else {
            glBindTexture(GL_TEXTURE_2D, m_id);
        }
        m_size = vec2(width, height);
        glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, width, height, 0, GL_RGBA, GL_UNSIGNED_BYTE, data);
    }